

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityTestResultsBegin(char *file,UNITY_UINT line)

{
  UnityPrint(file);
  putchar(0x3a);
  UnityPrintNumber(line);
  putchar(0x3a);
  UnityPrint(Unity.CurrentTestName);
  putchar(0x3a);
  return;
}

Assistant:

static void UnityTestResultsBegin(const char* file, const UNITY_LINE_TYPE line)
{
    UnityPrint(file);
    UNITY_OUTPUT_CHAR(':');
    UnityPrintNumber((UNITY_INT)line);
    UNITY_OUTPUT_CHAR(':');
    UnityPrint(Unity.CurrentTestName);
    UNITY_OUTPUT_CHAR(':');
}